

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

CURLcode Curl_http2_switch_at(Curl_cfilter *cf,Curl_easy *data)

{
  undefined1 *puVar1;
  Curl_cfilter *cf_00;
  connectdata *pcVar2;
  CURLcode CVar3;
  cf_h2_ctx *ctx;
  _Bool done;
  Curl_cfilter *local_28;
  
  local_28 = (Curl_cfilter *)0x0;
  ctx = (cf_h2_ctx *)(*Curl_ccalloc)(1,0xd0);
  if (ctx == (cf_h2_ctx *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    CVar3 = Curl_cf_create(&local_28,&Curl_cft_nghttp2,ctx);
    if (CVar3 == CURLE_OK) {
      Curl_conn_cf_insert_after(cf,local_28);
      cf_00 = cf->next;
      CVar3 = cf_h2_ctx_init(cf_00,data,false);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      pcVar2 = cf->conn;
      pcVar2->httpversion = '\x14';
      puVar1 = &(pcVar2->bits).field_0x2;
      *puVar1 = *puVar1 | 0x80;
      cf->conn->bundle->multiuse = 2;
      Curl_multi_connchanged(data->multi);
      if (cf_00->next == (Curl_cfilter *)0x0) {
        return CURLE_OK;
      }
      CVar3 = Curl_conn_cf_connect(cf_00,data,false,&done);
      return CVar3;
    }
  }
  cf_h2_ctx_free(ctx);
  return CVar3;
}

Assistant:

CURLcode Curl_http2_switch_at(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct Curl_cfilter *cf_h2;
  CURLcode result;

  DEBUGASSERT(!Curl_cf_is_http2(cf, data));

  result = http2_cfilter_insert_after(cf, data);
  if(result)
    return result;

  cf_h2 = cf->next;
  result = cf_h2_ctx_init(cf_h2, data, FALSE);
  if(result)
    return result;

  cf->conn->httpversion = 20; /* we know we're on HTTP/2 now */
  cf->conn->bits.multiplex = TRUE; /* at least potentially multiplexed */
  cf->conn->bundle->multiuse = BUNDLE_MULTIPLEX;
  Curl_multi_connchanged(data->multi);

  if(cf_h2->next) {
    bool done;
    return Curl_conn_cf_connect(cf_h2, data, FALSE, &done);
  }
  return CURLE_OK;
}